

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O3

QSslConfiguration __thiscall QNetworkAccessBackend::sslConfiguration(QNetworkAccessBackend *this)

{
  long in_RSI;
  
  if ((*(byte *)(*(long *)(in_RSI + 8) + 0x7c) & 1) != 0) {
    sslConfiguration();
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this);
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)this;
}

Assistant:

QSslConfiguration QNetworkAccessBackend::sslConfiguration() const
{
    if (securityFeatures() & SecurityFeature::TLS) {
        qWarning("Backend (%s) claiming to use TLS hasn't overridden sslConfiguration.",
                 metaObject()->className());
    }
    return {};
}